

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

wchar_t ego_item_name(char *buf,size_t buf_size,ego_desc *desc)

{
  ushort uVar1;
  short sVar2;
  ego_item *peVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  wchar_t wVar8;
  char prefix [100];
  char local_98 [104];
  
  peVar3 = e_info;
  uVar1 = desc->itype;
  wVar8 = L'\0';
  if (uVar1 < 0x19) {
    sVar2 = desc->e_idx;
    sVar4 = my_strcat(buf,"[ ] ",buf_size);
    sVar5 = my_strcat(buf,quality_choices[uVar1].name,buf_size);
    sVar6 = my_strcat(buf," ",buf_size);
    wVar8 = (int)sVar6 + (int)sVar4 + (int)sVar5;
    lVar7 = (long)desc->short_name - (long)peVar3[sVar2].name;
    if (lVar7 != 0) {
      my_strcpy(local_98,peVar3[sVar2].name,lVar7 + 1);
      sVar4 = my_strcat(buf,local_98,buf_size);
      wVar8 = wVar8 + (int)sVar4;
    }
  }
  return wVar8;
}

Assistant:

int ego_item_name(char *buf, size_t buf_size, struct ego_desc *desc)
{
	size_t i;
	int end;
	size_t prefix_size;
	const char *long_name;

	struct ego_item *ego = &e_info[desc->e_idx];

	/* Find the ignore type */
	for (i = 0; i < N_ELEMENTS(quality_choices); i++)
		if (desc->itype == i) break;

	if (i == N_ELEMENTS(quality_choices)) return 0;

	/* Initialize the buffer */
	end = my_strcat(buf, "[ ] ", buf_size);

	/* Append the name */
	end += my_strcat(buf, quality_choices[i].name, buf_size);

	/* Append an extra space */
	end += my_strcat(buf, " ", buf_size);

	/* Get the full ego-item name */
	long_name = ego->name;

	/* Get the length of the common prefix, if any */
	prefix_size = (desc->short_name - long_name);

	/* Found a prefix? */
	if (prefix_size > 0) {
		char prefix[100];

		/* Get a copy of the prefix */
		my_strcpy(prefix, long_name, prefix_size + 1);

		/* Append the prefix */
		end += my_strcat(buf, prefix, buf_size);
	}
	/* Set the name to the right length */
	return end;
}